

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemcache_test_mt.c
# Opt level: O1

void * worker_thread_put_in_gets(void *arg)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  uint *puVar5;
  ulong uStack_58;
  undefined1 uStack_49;
  void *pvStack_48;
  ulong *puStack_40;
  ulong uStack_38;
  code *pcStack_30;
  ulong local_28;
  
  uVar2 = (*arg & 1) + *(int *)((long)arg + 0x1c);
  local_28 = (ulong)uVar2;
  uVar1 = *(int *)((long)arg + 0x1c) * 3;
  if (uVar2 < uVar1) {
    do {
      puVar5 = *(uint **)((long)arg + 8);
      lVar4 = (local_28 % (ulong)*(uint *)((long)arg + 0x18)) * 0x10;
      pcStack_30 = (code *)0x103beb;
      iVar3 = vmemcache_put(puVar5,&local_28,8,
                            *(undefined8 *)(*(long *)((long)arg + 0x10) + 8 + lVar4),
                            *(undefined8 *)(*(long *)((long)arg + 0x10) + lVar4));
      if (iVar3 != 0) {
        pcStack_30 = worker_thread_test_evict_get;
        worker_thread_put_in_gets_cold_1();
        uStack_58 = (ulong)*puVar5;
        pvStack_48 = arg;
        puStack_40 = &local_28;
        uStack_38 = (ulong)uVar1;
        pcStack_30 = (code *)&stack0xfffffffffffffff8;
        do {
          if (keep_running == 0) {
            return (void *)0x0;
          }
          lVar4 = vmemcache_get(*(undefined8 *)(puVar5 + 2),&uStack_58,8,&uStack_49,1,0,0);
        } while (lVar4 == 1);
        return (void *)0x0;
      }
      local_28 = local_28 + 2;
    } while (local_28 < uVar1);
  }
  return (void *)0x0;
}

Assistant:

static void *
worker_thread_put_in_gets(void *arg)
{
	struct context *ctx = arg;
	unsigned long long i;
	unsigned long long start = ctx->ops_count + (ctx->thread_number & 0x1);

	/*
	 * There is '3' here - in order to have the same number (ctx->ops_count)
	 * of operations per each thread.
	 */
	unsigned long long end = 3 * ctx->ops_count;

	for (i = start; i < end; i += 2) {
		if (vmemcache_put(ctx->cache, &i, sizeof(i),
				ctx->buffs[i % ctx->nbuffs].buff,
				ctx->buffs[i % ctx->nbuffs].size))
			UT_FATAL("ERROR: vmemcache_put: %s",
					vmemcache_errormsg());
	}

	return NULL;
}